

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kernel_type.hpp
# Opt level: O0

void __thiscall
ExchCXX::detail::BuiltinKernelImpl<ExchCXX::BuiltinSCANL_C,void>::
eval_exc_inc_<double&,int&,double_const*&,double_const*&,double_const*&,double_const*&,double*&>
          (BuiltinKernelImpl<ExchCXX::BuiltinSCANL_C,_void> *this,double *args,int *args_1,
          double **args_2,double **args_3,double **args_4,double **args_5,double **args_6)

{
  bool bVar1;
  host_buffer_type in_RCX;
  const_host_buffer_type in_RDX;
  const_host_buffer_type in_RSI;
  BuiltinKernel *in_RDI;
  const_host_buffer_type unaff_retaddr;
  int in_stack_0000003c;
  
  bVar1 = BuiltinKernel::is_polarized(in_RDI);
  if (bVar1) {
    host_eval_exc_inc_helper_polar<ExchCXX::BuiltinSCANL_C>
              ((double)args_5,in_stack_0000003c,(const_host_buffer_type)this,args,
               (const_host_buffer_type)args_1,(const_host_buffer_type)args_2,
               (host_buffer_type)args_3);
  }
  else {
    host_eval_exc_inc_helper_unpolar<ExchCXX::BuiltinSCANL_C>
              ((double)args_3,args_4._4_4_,unaff_retaddr,(const_host_buffer_type)in_RDI,in_RSI,
               in_RDX,in_RCX);
  }
  return;
}

Assistant:

void eval_exc_inc_(Args&&... args) const {
    if( is_polarized() )
      host_eval_exc_inc_helper_polar<KernelType>(
        std::forward<Args>(args)...
      );
    else
      host_eval_exc_inc_helper_unpolar<KernelType>(
        std::forward<Args>(args)...
      );
  }